

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.c
# Opt level: O3

void parse_number_should_parse_negative_reals(void)

{
  assert_parse_number("-0.001",0,-0.001);
  assert_parse_number("-10e-10",0,-1e-09);
  assert_parse_number("-10E-10",0,-1e-09);
  assert_parse_number("-10e20",-0x80000000,-1e+21);
  assert_parse_number("-123e+127",-0x80000000,-1.23e+129);
  assert_parse_number("-123e-128",0,-1.23e-126);
  return;
}

Assistant:

static void parse_number_should_parse_negative_reals(void)
{
    assert_parse_number("-0.001", 0, -0.001);
    assert_parse_number("-10e-10", 0, -10e-10);
    assert_parse_number("-10E-10", 0, -10e-10);
    assert_parse_number("-10e20", INT_MIN, -10e20);
    assert_parse_number("-123e+127", INT_MIN, -123e127);
    assert_parse_number("-123e-128", 0, -123e-128);
}